

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialEvaluation.cpp
# Opt level: O3

Monom<Kernel::NumTraits<Kernel::RealConstantType>_> * __thiscall
Inferences::simplifyMonom<Kernel::NumTraits<Kernel::RealConstantType>>
          (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *__return_storage_ptr__,
          Inferences *this,Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *in,
          PolyNf *simplifiedArgs,bool removeZeros)

{
  undefined4 uVar1;
  undefined8 uVar2;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *pMVar3;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_PolynomialEvaluation_cpp:364:18),_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  it;
  undefined1 auVar4 [32];
  DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  *pDVar5;
  byte bVar6;
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  byte bVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *pMVar16;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *pMVar17;
  anon_class_16_2_20c48a23 f;
  anon_class_1_0_00000001 pow;
  int power;
  Option<Kernel::RealConstantType> c;
  Numeral numeral;
  undefined1 local_1dd;
  uint local_1dc;
  undefined1 local_1d8;
  anon_class_1_0_00000001 local_1d5;
  uint local_1d4;
  undefined1 uStack_1d0;
  int local_1cc;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_1c8;
  Numeral local_1a8;
  undefined1 local_180;
  undefined7 uStack_17f;
  undefined1 uStack_178;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *local_170;
  undefined4 local_164;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *local_160;
  long local_158;
  __mpz_struct local_150;
  __mpz_struct local_140;
  undefined1 local_130 [40];
  RationalConstantType local_108;
  uint local_e8 [2];
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *local_e0;
  Numeral *local_d8;
  long lStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  unsigned_long local_b8;
  RealConstantType local_b0;
  __mpz_struct local_90;
  __mpz_struct local_80;
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> local_70;
  __mpz_struct local_50;
  __mpz_struct local_40;
  
  local_164 = SUB84(simplifiedArgs,0);
  lVar10 = *(long *)(this + 0x28);
  local_160 = in;
  Kernel::RealConstantType::RealConstantType
            ((RealConstantType *)&local_108,(RealConstantType *)this);
  uVar8 = (int)((ulong)(*(long *)(lVar10 + 0x10) - *(long *)(lVar10 + 8)) >> 2) * -0x49249249;
  local_1c8._capacity = (size_t)uVar8;
  local_170 = __return_storage_ptr__;
  local_158 = lVar10;
  if (uVar8 == 0) {
    local_1c8._cursor = (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0;
    local_1c8._end = (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0;
    local_1c8._stack = local_1c8._cursor;
  }
  else {
    uVar12 = local_1c8._capacity * 0x1c + 0xf & 0x3ffffffff0;
    if (uVar12 == 0) {
      local_1c8._stack =
           (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)
           Lib::FixedSizeAllocator<8UL>::alloc
                     ((FixedSizeAllocator<8UL> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar12 < 0x11) {
      local_1c8._stack =
           (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)
           Lib::FixedSizeAllocator<16UL>::alloc
                     ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    }
    else if (uVar12 < 0x19) {
      local_1c8._stack =
           (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)
           Lib::FixedSizeAllocator<24UL>::alloc
                     ((FixedSizeAllocator<24UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    }
    else if (uVar12 < 0x21) {
      local_1c8._stack =
           (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)
           Lib::FixedSizeAllocator<32UL>::alloc
                     ((FixedSizeAllocator<32UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar12 < 0x31) {
      local_1c8._stack =
           (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)
           Lib::FixedSizeAllocator<48UL>::alloc
                     ((FixedSizeAllocator<48UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar12 < 0x41) {
      local_1c8._stack =
           (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)
           Lib::FixedSizeAllocator<64UL>::alloc
                     ((FixedSizeAllocator<64UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      local_1c8._stack =
           (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)::operator_new(uVar12,0x10);
    }
    lVar10 = *(long *)(local_158 + 8);
    local_1c8._end = local_1c8._stack + local_1c8._capacity;
    local_1c8._cursor = local_1c8._stack;
    if ((int)((ulong)(*(long *)(local_158 + 0x10) - lVar10) >> 2) * -0x49249249 != 0) {
      lVar15 = 0x18;
      uVar12 = 0;
      pMVar17 = local_160;
      do {
        local_1cc = *(int *)(lVar10 + lVar15);
        local_1a8.super_RationalConstantType._num._val[0]._mp_alloc._0_1_ = (byte)local_1cc;
        local_1a8.super_RationalConstantType._num._val[0]._mp_alloc._1_1_ =
             (byte)((uint)local_1cc >> 8);
        local_1a8.super_RationalConstantType._num._val[0]._mp_alloc._2_2_ =
             (undefined2)((uint)local_1cc >> 0x10);
        bVar6 = (byte)(pMVar17->numeral).super_RationalConstantType._num._val[0]._mp_alloc;
        bVar11 = bVar6 & 3;
        if ((bVar6 & 3) == 0) {
          uVar8 = *(uint *)((long)&(pMVar17->numeral).super_RationalConstantType._num._val[0].
                                   _mp_alloc + 1);
          uVar2 = *(undefined8 *)
                   ((long)&(pMVar17->numeral).super_RationalConstantType._num._val[0]._mp_d + 1);
          uStack_1d0 = 0;
          uStack_178 = 0;
          local_180 = (undefined1)uVar2;
          uStack_17f = (undefined7)((ulong)uVar2 >> 8);
          bVar7 = true;
          local_1d4 = uVar8;
LAB_00504351:
          if (local_1c8._cursor == local_1c8._end) {
            Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::expand
                      (&local_1c8);
          }
          *(undefined8 *)
           &((local_1c8._cursor)->term).super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               = 0;
          pDVar5 = &((local_1c8._cursor)->term).super_PolyNfSuper._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          ;
          (pDVar5->
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          )._content[7] = '\0';
          (pDVar5->
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          )._content[8] = '\0';
          (pDVar5->
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          )._content[9] = '\0';
          (pDVar5->
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          )._content[10] = '\0';
          (pDVar5->
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          )._content[0xb] = '\0';
          (pDVar5->
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          )._content[0xc] = '\0';
          (pDVar5->
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          )._content[0xd] = '\0';
          (pDVar5->
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          )._content[0xe] = '\0';
          *(undefined8 *)
           (((local_1c8._cursor)->term).super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content + 0xf) = 0;
          *(byte *)&((local_1c8._cursor)->term).super_PolyNfSuper._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                    .
                    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               = bVar11;
          if (bVar7) {
            *(uint *)((local_1c8._cursor)->term).super_PolyNfSuper._inner.
                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                     .
                     super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                     ._content = local_1d4;
            *(ulong *)(((local_1c8._cursor)->term).super_PolyNfSuper._inner.
                       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                       .
                       super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                       ._content + 8) = CONCAT71(uStack_17f,local_180);
          }
          else if (bVar11 == 1) {
            *(uint *)((local_1c8._cursor)->term).super_PolyNfSuper._inner.
                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                     .
                     super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                     ._content = local_1d4;
          }
          else {
            pDVar5 = &((local_1c8._cursor)->term).super_PolyNfSuper._inner.
                      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            ;
            (pDVar5->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[4] = '\0';
            (pDVar5->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[5] = '\0';
            (pDVar5->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[6] = '\0';
            (pDVar5->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[7] = '\0';
            (pDVar5->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[8] = '\0';
            (pDVar5->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[9] = '\0';
            (pDVar5->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[10] = '\0';
            (pDVar5->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[0xb] = '\0';
            pDVar5 = &((local_1c8._cursor)->term).super_PolyNfSuper._inner.
                      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            ;
            (pDVar5->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[0xc] = '\0';
            (pDVar5->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[0xd] = '\0';
            (pDVar5->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[0xe] = '\0';
            (pDVar5->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[0xf] = '\0';
            (pDVar5->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[0x10] = '\0';
            (pDVar5->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[0x11] = '\0';
            (pDVar5->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[0x12] = '\0';
            (pDVar5->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[0x13] = '\0';
            ((local_1c8._cursor)->term).super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[0] = (byte)uVar8 & 3;
            *(uint *)(((local_1c8._cursor)->term).super_PolyNfSuper._inner.
                      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                      .
                      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                      ._content + 1) = CONCAT13(uStack_1d0,local_1d4._1_3_);
            *(ulong *)(((local_1c8._cursor)->term).super_PolyNfSuper._inner.
                       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                       .
                       super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                       ._content + 9) = CONCAT17(uStack_178,uStack_17f);
          }
          (local_1c8._cursor)->power = local_1cc;
          local_1c8._cursor = local_1c8._cursor + 1;
        }
        else {
          if (bVar11 != 2) {
            if (bVar11 != 1) {
              pMVar3 = (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)
                       ((long)&(local_160->numeral).super_RationalConstantType._num + uVar12 * 0x18)
              ;
              goto LAB_00504327;
            }
            uVar8 = *(uint *)((long)&(pMVar17->numeral).super_RationalConstantType._num._val[0].
                                     _mp_alloc + 1);
            bVar7 = false;
            uStack_1d0 = 0;
            uStack_178 = 0;
            local_180 = 0;
            uStack_17f = 0;
            local_1d4 = uVar8;
            goto LAB_00504351;
          }
          pMVar3 = pMVar17;
          if (((pMVar17->numeral).super_RationalConstantType._num._val[0]._mp_alloc & 0x300) !=
              0x200) {
LAB_00504327:
            bVar6 = *(byte *)((long)&(pMVar3->numeral).super_RationalConstantType._num._val[0].
                                     _mp_alloc + 1);
            uVar8 = (uint)(bVar6 & 3);
            uVar2 = *(undefined8 *)
                     ((long)&(pMVar17->numeral).super_RationalConstantType._num._val[0]._mp_d + 2);
            uVar1 = *(undefined4 *)
                     ((long)&(pMVar17->numeral).super_RationalConstantType._num._val[0]._mp_alloc +
                     2);
            local_180 = 0;
            local_1d4._1_3_ = (undefined3)uVar1;
            local_1d4 = CONCAT31(local_1d4._1_3_,bVar6) & 0xffffff03;
            uStack_1d0 = (undefined1)((uint)uVar1 >> 0x18);
            uStack_17f = (undefined7)uVar2;
            uStack_178 = (undefined1)((ulong)uVar2 >> 0x38);
            bVar7 = false;
            goto LAB_00504351;
          }
          lVar10 = *(long *)((long)&(pMVar17->numeral).super_RationalConstantType._num._val[0]._mp_d
                            + 2);
          if ((int)((ulong)(*(long *)(lVar10 + 0x10) - (long)*(RealConstantType **)(lVar10 + 8)) >>
                   4) * -0x55555555 != 1) goto LAB_00504327;
          Kernel::RealConstantType::RealConstantType
                    ((RealConstantType *)&local_90,*(RealConstantType **)(lVar10 + 8));
          simplifyMonom<Kernel::NumTraits<Kernel::RealConstantType>_>::anon_class_1_0_00000001::
          operator()((Numeral *)local_130,&local_1d5,(Numeral *)&local_90,
                     CONCAT22(local_1a8.super_RationalConstantType._num._val[0]._mp_alloc._2_2_,
                              CONCAT11(local_1a8.super_RationalConstantType._num._val[0]._mp_alloc.
                                       _1_1_,(byte)local_1a8.super_RationalConstantType._num._val[0]
                                                   ._mp_alloc)));
          Kernel::RationalConstantType::operator*=(&local_108,(RationalConstantType *)local_130);
          mpz_clear((__mpz_struct *)(local_130 + 0x10));
          mpz_clear((__mpz_struct *)local_130);
          mpz_clear(&local_80);
          mpz_clear(&local_90);
          lStack_d0 = *(long *)(*(long *)(lVar10 + 8) + 0x28);
          local_b8 = (*(long *)(lStack_d0 + 0x10) - *(long *)(lStack_d0 + 8) >> 2) *
                     0x6db6db6db6db6db7;
          local_c8 = 0;
          uStack_c0 = 0;
          local_d8 = &local_1a8;
          auVar4 = ZEXT1632(CONCAT88(lStack_d0,local_d8));
          it._iter._inner._inner._to = local_b8;
          it._iter._func.power = (int *)auVar4._0_8_;
          it._iter._inner._func.a =
               (Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)
               auVar4._8_8_;
          it._iter._inner._inner._next = auVar4._16_8_;
          it._iter._inner._inner._from = auVar4._24_8_;
          Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>::
          loadFromIterator<Lib::IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>,unsigned_long>(Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>const&,unsigned_long)::_lambda(auto:1)_1_,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>const&>,Inferences::simplifyMonom<Kernel::NumTraits<Kernel::RealConstantType>>(Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>const&,Kernel::PolyNf*,bool)::_lambda(auto:1)_1_,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>>>
                    ((Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>> *)
                     &local_1c8,it);
        }
        pMVar16 = local_1c8._stack;
        uVar12 = uVar12 + 1;
        lVar10 = *(long *)(local_158 + 8);
        pMVar17 = (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)
                  &(pMVar17->numeral).super_RationalConstantType._den._val[0]._mp_d;
        lVar15 = lVar15 + 0x1c;
      } while (uVar12 < (uint)((int)((ulong)(*(long *)(local_158 + 0x10) - lVar10) >> 2) *
                              -0x49249249));
      __return_storage_ptr__ = local_170;
      if (local_1c8._stack != local_1c8._cursor) {
        uVar12 = ((long)local_1c8._cursor - (long)local_1c8._stack >> 2) * 0x6db6db6db6db6db7;
        lVar10 = 0x3f;
        if (uVar12 != 0) {
          for (; uVar12 >> lVar10 == 0; lVar10 = lVar10 + -1) {
          }
        }
        std::
        __introsort_loop<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>*,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_1c8._stack,local_1c8._cursor,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
        __return_storage_ptr__ = local_170;
        std::
        __final_insertion_sort<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>*,__gnu_cxx::__ops::_Iter_less_iter>
                  (pMVar16);
      }
    }
  }
  lVar10 = 0;
  if (local_1c8._cursor != local_1c8._stack) {
    uVar12 = 0;
    local_1cc = 0;
    do {
      iVar13 = (int)uVar12;
      pMVar16 = local_1c8._stack + uVar12;
      local_1a8.super_RationalConstantType._num._val[0]._mp_alloc._0_1_ = (byte)&local_1dd;
      local_1a8.super_RationalConstantType._num._val[0]._mp_alloc._1_1_ =
           (byte)((ulong)&local_1dd >> 8);
      local_1a8.super_RationalConstantType._num._val[0]._mp_alloc._2_2_ =
           (undefined2)((ulong)&local_1dd >> 0x10);
      local_1a8.super_RationalConstantType._num._val[0]._mp_size._0_1_ =
           (undefined1)((ulong)&local_1dd >> 0x20);
      local_1a8.super_RationalConstantType._num._val[0]._mp_size._1_1_ =
           (undefined1)((ulong)&local_1dd >> 0x28);
      local_1a8.super_RationalConstantType._num._val[0]._mp_size._2_2_ =
           (undefined2)((ulong)&local_1dd >> 0x30);
      local_1a8.super_RationalConstantType._num._val[0]._mp_d._0_1_ = SUB81(&local_1dc,0);
      local_1a8.super_RationalConstantType._num._val[0]._mp_d._1_1_ =
           (undefined1)((ulong)&local_1dc >> 8);
      local_1a8.super_RationalConstantType._num._val[0]._mp_d._2_6_ =
           (undefined6)((ulong)&local_1dc >> 0x10);
      local_1a8.super_RationalConstantType._den._val[0]._mp_alloc._0_1_ = SUB81(&local_150,0);
      local_1a8.super_RationalConstantType._den._val[0]._1_4_ = SUB84((ulong)&local_150 >> 8,0);
      local_1a8.super_RationalConstantType._den._val[0]._mp_size._1_3_ =
           (undefined3)((ulong)&local_150 >> 0x28);
      f.this = (Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                *)pMVar16;
      f.fs_ = (tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:921:7)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:922:7)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:923:7)_&>
               *)&local_1a8;
      Lib::CoproductImpl::
      RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
      ::
      switchN<Lib::Coproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>::match<Kernel::PolyNf::tryNumeral<Kernel::NumTraits<Kernel::RealConstantType>>()const::_lambda(Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>)_1_,Kernel::PolyNf::tryNumeral<Kernel::NumTraits<Kernel::RealConstantType>>()const::_lambda(Kernel::Variable)_1_,Kernel::PolyNf::tryNumeral<Kernel::NumTraits<Kernel::RealConstantType>>()const::_lambda(Kernel::AnyPoly)_1_>(Kernel::PolyNf::tryNumeral<Kernel::NumTraits<Kernel::RealConstantType>>()const::_lambda(Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>)_1_,Kernel::PolyNf::tryNumeral<Kernel::NumTraits<Kernel::RealConstantType>>()const::_lambda(Kernel::Variable)_1_,Kernel::PolyNf::tryNumeral<Kernel::NumTraits<Kernel::RealConstantType>>()const::_lambda(Kernel::AnyPoly)_1_)const&::_lambda(auto:1)_1_>
                ((ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3),_Constant<0>_>_conflict26
                  *)local_130,
                 (RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                  *)pMVar16,f);
      if (local_130[0] == true) {
        Kernel::RealConstantType::RealConstantType
                  ((RealConstantType *)&local_50,(RealConstantType *)(local_130 + 8));
        simplifyMonom<Kernel::NumTraits<Kernel::RealConstantType>_>::anon_class_1_0_00000001::
        operator()(&local_1a8,&local_1d5,(Numeral *)&local_50,pMVar16->power);
        mpz_clear(&local_40);
        mpz_clear(&local_50);
        Kernel::RealConstantType::operator*
                  ((RealConstantType *)&local_150,(RealConstantType *)&local_108,&local_1a8);
        mpz_set((__mpz_struct *)&local_108,&local_150);
        mpz_set(local_108._den._val,&local_140);
        mpz_clear(&local_140);
        mpz_clear(&local_150);
        mpz_clear(local_1a8.super_RationalConstantType._den._val);
        mpz_clear((__mpz_struct *)&local_1a8);
      }
      else {
        local_1a8.super_RationalConstantType._num._val[0]._mp_size._1_1_ = 0;
        local_1a8.super_RationalConstantType._num._val[0]._mp_d._1_1_ = 0;
        local_1a8.super_RationalConstantType._num._val[0]._mp_d._2_6_ = 0;
        local_1a8.super_RationalConstantType._den._val[0]._mp_alloc._0_1_ = 0;
        local_1a8.super_RationalConstantType._den._val[0]._1_4_ = 0;
        local_1a8.super_RationalConstantType._den._val[0]._mp_size._1_3_ = 0;
        local_1a8.super_RationalConstantType._num._val[0]._mp_alloc._0_1_ =
             *(byte *)&(pMVar16->term).super_PolyNfSuper._inner.
                       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                       .
                       super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             & 3;
        if ((byte)local_1a8.super_RationalConstantType._num._val[0]._mp_alloc == 0) {
          uVar1 = *(undefined4 *)
                   (pMVar16->term).super_PolyNfSuper._inner.
                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                   .
                   super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                   ._content;
          local_1a8.super_RationalConstantType._num._val[0]._mp_alloc._1_1_ = (byte)uVar1;
          local_1a8.super_RationalConstantType._num._val[0]._mp_alloc._2_2_ =
               (undefined2)((uint)uVar1 >> 8);
          local_1a8.super_RationalConstantType._num._val[0]._mp_size._0_1_ =
               (undefined1)((uint)uVar1 >> 0x18);
          uVar2 = *(undefined8 *)
                   ((pMVar16->term).super_PolyNfSuper._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                    .
                    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                    ._content + 8);
          local_1a8.super_RationalConstantType._num._val[0]._mp_d._1_1_ = (undefined1)uVar2;
          local_1a8.super_RationalConstantType._num._val[0]._mp_d._2_6_ =
               (undefined6)((ulong)uVar2 >> 8);
          local_1a8.super_RationalConstantType._den._val[0]._mp_alloc._0_1_ =
               (undefined1)((ulong)uVar2 >> 0x38);
        }
        else if ((byte)local_1a8.super_RationalConstantType._num._val[0]._mp_alloc == 1) {
          uVar1 = *(undefined4 *)
                   (pMVar16->term).super_PolyNfSuper._inner.
                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                   .
                   super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                   ._content;
          local_1a8.super_RationalConstantType._num._val[0]._mp_alloc._1_1_ = (byte)uVar1;
          local_1a8.super_RationalConstantType._num._val[0]._mp_alloc._2_2_ =
               (undefined2)((uint)uVar1 >> 8);
          local_1a8.super_RationalConstantType._num._val[0]._mp_size._0_1_ =
               (undefined1)((uint)uVar1 >> 0x18);
        }
        else {
          local_1a8.super_RationalConstantType._num._val[0]._mp_d._1_1_ = 0;
          local_1a8.super_RationalConstantType._num._val[0]._mp_alloc._1_1_ =
               (pMVar16->term).super_PolyNfSuper._inner.
               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
               .
               super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               ._content[0] & 3;
          uVar2 = *(undefined8 *)
                   ((pMVar16->term).super_PolyNfSuper._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                    .
                    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                    ._content + 9);
          uVar1 = *(undefined4 *)
                   ((pMVar16->term).super_PolyNfSuper._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                    .
                    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                    ._content + 1);
          local_1a8.super_RationalConstantType._num._val[0]._mp_alloc._2_2_ = (undefined2)uVar1;
          local_1a8.super_RationalConstantType._num._val[0]._mp_size._0_1_ =
               (undefined1)((uint)uVar1 >> 0x10);
          local_1a8.super_RationalConstantType._num._val[0]._mp_size._1_1_ =
               (undefined1)((uint)uVar1 >> 0x18);
          local_1a8.super_RationalConstantType._num._val[0]._mp_d._2_6_ = (undefined6)uVar2;
          local_1a8.super_RationalConstantType._den._val[0]._mp_alloc._0_1_ =
               (undefined1)((ulong)uVar2 >> 0x30);
          local_1a8.super_RationalConstantType._den._val[0]._mp_alloc._1_1_ =
               (byte)((ulong)uVar2 >> 0x38);
          local_1a8.super_RationalConstantType._den._val[0]._2_3_ = 0;
        }
        local_1a8.super_RationalConstantType._num._val[0]._mp_d._0_1_ = 0;
        local_1a8.super_RationalConstantType._num._val[0]._mp_size._2_2_ = 0;
        iVar14 = pMVar16->power;
        uVar8 = iVar13 + 1;
        lVar10 = (long)local_1c8._cursor - (long)local_1c8._stack;
        while( true ) {
          uVar9 = (ulong)uVar8;
          iVar13 = (int)uVar12;
          if (((ulong)((lVar10 >> 2) * 0x6db6db6db6db6db7) <= uVar9) ||
             (bVar7 = Kernel::operator==(&local_1c8._stack[uVar9].term,(PolyNf *)&local_1a8), !bVar7
             )) break;
          iVar14 = iVar14 + local_1c8._stack[uVar9].power;
          uVar8 = iVar13 + 2;
          lVar10 = (long)local_1c8._cursor - (long)local_1c8._stack;
          uVar12 = (ulong)(iVar13 + 1);
        }
        if (iVar14 != 0) {
          bVar6 = (byte)local_1a8.super_RationalConstantType._num._val[0]._mp_alloc & 3;
          if (bVar6 == 1) {
            uVar8 = CONCAT13((undefined1)local_1a8.super_RationalConstantType._num._val[0]._mp_size,
                             CONCAT21(local_1a8.super_RationalConstantType._num._val[0]._mp_alloc.
                                      _2_2_,local_1a8.super_RationalConstantType._num._val[0].
                                            _mp_alloc._1_1_));
            local_1d8 = 0;
            local_150._mp_d._0_1_ = 0;
            local_150._mp_alloc._0_1_ = 0;
            local_150._1_7_ = 0;
            local_1dc = uVar8;
          }
          else if (((byte)local_1a8.super_RationalConstantType._num._val[0]._mp_alloc & 3) == 0) {
            uVar8 = CONCAT13((undefined1)local_1a8.super_RationalConstantType._num._val[0]._mp_size,
                             CONCAT21(local_1a8.super_RationalConstantType._num._val[0]._mp_alloc.
                                      _2_2_,local_1a8.super_RationalConstantType._num._val[0].
                                            _mp_alloc._1_1_));
            local_1d8 = 0;
            local_150._mp_d._0_1_ = 0;
            local_150._mp_alloc._0_1_ =
                 local_1a8.super_RationalConstantType._num._val[0]._mp_d._1_1_;
            local_150._1_7_ =
                 SUB87(CONCAT17((undefined1)
                                local_1a8.super_RationalConstantType._den._val[0]._mp_alloc,
                                CONCAT61(local_1a8.super_RationalConstantType._num._val[0]._mp_d.
                                         _2_6_,local_1a8.super_RationalConstantType._num._val[0].
                                               _mp_d._1_1_)) >> 8,0);
            local_1dc = uVar8;
          }
          else {
            uVar8 = (uint)(local_1a8.super_RationalConstantType._num._val[0]._mp_alloc._1_1_ & 3);
            local_150._mp_size._3_1_ =
                 (undefined1)local_1a8.super_RationalConstantType._den._val[0]._mp_alloc;
            local_150._1_6_ = local_1a8.super_RationalConstantType._num._val[0]._mp_d._2_6_;
            local_150._mp_alloc._0_1_ = 0;
            local_1dc = CONCAT31(CONCAT12((undefined1)
                                          local_1a8.super_RationalConstantType._num._val[0]._mp_size
                                          ,local_1a8.super_RationalConstantType._num._val[0].
                                           _mp_alloc._2_2_),
                                 local_1a8.super_RationalConstantType._num._val[0]._mp_alloc._1_1_)
                        & 0xffffff03;
            local_1d8 = local_1a8.super_RationalConstantType._num._val[0]._mp_size._1_1_;
            local_150._mp_d._0_1_ =
                 local_1a8.super_RationalConstantType._den._val[0]._mp_alloc._1_1_;
          }
          lVar10 = (long)local_1cc;
          *(undefined8 *)
           &local_1c8._stack[lVar10].term.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               = 0;
          pDVar5 = &local_1c8._stack[lVar10].term.super_PolyNfSuper._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          ;
          (pDVar5->
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          )._content[7] = '\0';
          (pDVar5->
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          )._content[8] = '\0';
          (pDVar5->
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          )._content[9] = '\0';
          (pDVar5->
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          )._content[10] = '\0';
          (pDVar5->
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          )._content[0xb] = '\0';
          (pDVar5->
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          )._content[0xc] = '\0';
          (pDVar5->
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          )._content[0xd] = '\0';
          (pDVar5->
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          )._content[0xe] = '\0';
          *(undefined8 *)
           (local_1c8._stack[lVar10].term.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content + 0xf) = 0;
          *(byte *)&local_1c8._stack[lVar10].term.super_PolyNfSuper._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                    .
                    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               = bVar6;
          if (bVar6 == 0) {
            *(uint *)local_1c8._stack[lVar10].term.super_PolyNfSuper._inner.
                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                     .
                     super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                     ._content = local_1dc;
            *(ulong *)(local_1c8._stack[lVar10].term.super_PolyNfSuper._inner.
                       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                       .
                       super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                       ._content + 8) = CONCAT71(local_150._1_7_,(undefined1)local_150._mp_alloc);
          }
          else if (bVar6 == 1) {
            *(uint *)local_1c8._stack[lVar10].term.super_PolyNfSuper._inner.
                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                     .
                     super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                     ._content = local_1dc;
          }
          else {
            pDVar5 = &local_1c8._stack[lVar10].term.super_PolyNfSuper._inner.
                      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            ;
            (pDVar5->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[4] = '\0';
            (pDVar5->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[5] = '\0';
            (pDVar5->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[6] = '\0';
            (pDVar5->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[7] = '\0';
            (pDVar5->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[8] = '\0';
            (pDVar5->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[9] = '\0';
            (pDVar5->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[10] = '\0';
            (pDVar5->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[0xb] = '\0';
            pDVar5 = &local_1c8._stack[lVar10].term.super_PolyNfSuper._inner.
                      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            ;
            (pDVar5->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[0xc] = '\0';
            (pDVar5->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[0xd] = '\0';
            (pDVar5->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[0xe] = '\0';
            (pDVar5->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[0xf] = '\0';
            (pDVar5->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[0x10] = '\0';
            (pDVar5->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[0x11] = '\0';
            (pDVar5->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[0x12] = '\0';
            (pDVar5->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[0x13] = '\0';
            local_1c8._stack[lVar10].term.super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content[0] = (byte)uVar8 & 3;
            *(uint *)(local_1c8._stack[lVar10].term.super_PolyNfSuper._inner.
                      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                      .
                      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                      ._content + 1) = CONCAT13(local_1d8,local_1dc._1_3_);
            *(ulong *)(local_1c8._stack[lVar10].term.super_PolyNfSuper._inner.
                       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                       .
                       super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                       ._content + 9) = CONCAT17(local_150._mp_d._0_1_,local_150._1_7_);
          }
          local_1c8._stack[lVar10].power = iVar14;
          local_1cc = local_1cc + 1;
        }
      }
      Lib::OptionBase<Kernel::RealConstantType>::~OptionBase
                ((OptionBase<Kernel::RealConstantType> *)local_130);
      uVar12 = (ulong)(iVar13 + 1);
      uVar9 = ((long)local_1c8._cursor - (long)local_1c8._stack >> 2) * 0x6db6db6db6db6db7;
    } while (uVar12 <= uVar9 && uVar9 - uVar12 != 0);
    lVar10 = (long)local_1cc;
    __return_storage_ptr__ = local_170;
  }
  local_1c8._cursor = local_1c8._stack + lVar10;
  Kernel::RealConstantType::RealConstantType((RealConstantType *)local_130,0);
  bVar7 = Kernel::RationalConstantType::operator==(&local_108,(RationalConstantType *)local_130);
  mpz_clear((__mpz_struct *)(local_130 + 0x10));
  mpz_clear((__mpz_struct *)local_130);
  if ((bVar7 & (byte)local_164) == 0) {
    Kernel::RealConstantType::RealConstantType(&local_b0,(RealConstantType *)&local_108);
    local_70._factors._capacity = local_1c8._capacity;
    local_1c8._capacity = 0;
    local_70._factors._end = local_1c8._end;
    local_1c8._end = (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0;
    local_70._factors._stack = local_1c8._stack;
    local_70._factors._cursor = local_1c8._cursor;
    local_1c8._stack = (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0;
    local_1c8._cursor = (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0;
    Lib::
    perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>
              ((Lib *)local_e8,&local_70);
    Kernel::RealConstantType::RealConstantType(&__return_storage_ptr__->numeral,&local_b0);
    (__return_storage_ptr__->factors)._id = local_e8[0];
    (__return_storage_ptr__->factors)._ptr = local_e0;
    if (local_70._factors._stack != (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0
       ) {
      uVar12 = local_70._factors._capacity * 0x1c + 0xf & 0xfffffffffffffff0;
      if (uVar12 == 0) {
        *(undefined8 *)
         &((local_70._factors._stack)->term).super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_70._factors._stack;
      }
      else if (uVar12 < 0x11) {
        *(undefined8 *)
         &((local_70._factors._stack)->term).super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_70._factors._stack;
      }
      else if (uVar12 < 0x19) {
        *(undefined8 *)
         &((local_70._factors._stack)->term).super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_70._factors._stack;
      }
      else if (uVar12 < 0x21) {
        *(undefined8 *)
         &((local_70._factors._stack)->term).super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_70._factors._stack;
      }
      else if (uVar12 < 0x31) {
        *(undefined8 *)
         &((local_70._factors._stack)->term).super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_70._factors._stack;
      }
      else if (uVar12 < 0x41) {
        *(undefined8 *)
         &((local_70._factors._stack)->term).super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_70._factors._stack;
      }
      else {
        operator_delete(local_70._factors._stack,0x10);
      }
    }
    mpz_clear(local_b0.super_RationalConstantType._den._val);
    mpz_clear((__mpz_struct *)&local_b0);
  }
  else {
    Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::zero();
  }
  if (local_1c8._stack != (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0) {
    uVar12 = local_1c8._capacity * 0x1c + 0xf & 0xfffffffffffffff0;
    if (uVar12 == 0) {
      *(undefined8 *)
       &((local_1c8._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_1c8._stack;
    }
    else if (uVar12 < 0x11) {
      *(undefined8 *)
       &((local_1c8._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_1c8._stack;
    }
    else if (uVar12 < 0x19) {
      *(undefined8 *)
       &((local_1c8._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_1c8._stack;
    }
    else if (uVar12 < 0x21) {
      *(undefined8 *)
       &((local_1c8._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_1c8._stack;
    }
    else if (uVar12 < 0x31) {
      *(undefined8 *)
       &((local_1c8._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_1c8._stack;
    }
    else if (uVar12 < 0x41) {
      *(undefined8 *)
       &((local_1c8._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_1c8._stack;
    }
    else {
      operator_delete(local_1c8._stack,0x10);
    }
  }
  mpz_clear(local_108._den._val);
  mpz_clear((__mpz_struct *)&local_108);
  return __return_storage_ptr__;
}

Assistant:

Monom<Number> simplifyMonom(Monom<Number> const& in, PolyNf* simplifiedArgs, bool removeZeros)
{ 

  using Numeral      = typename Number::ConstantType;
  using Monom        = Monom<Number>;
  using MonomFactor  = MonomFactor<Number>;
  using MonomFactors = MonomFactors<Number>;

  auto pow = [](Numeral c, int power) -> Numeral {
    ASS(power > 0)
    auto out = c;
    while (--power > 0) {
      out = out * c;
    }
    return out;
  };

  
  auto& facs = *in.factors;
  auto numeral = in.numeral;
  Stack<MonomFactor> args(facs.nFactors());
  for (unsigned i = 0; i < facs.nFactors(); i++) {
    auto power = facs.factorAt(i).power;
    if (auto poly_ = simplifiedArgs[i].downcast<Number>()) {
      auto& poly = **poly_;
      if (poly.nSummands() == 1) {
        numeral *= pow(poly.summandAt(0).numeral, power);
        args.loadFromIterator(
            poly.summandAt(0).factors->iter()
            .map([&](auto fac) { fac.power *= power; return fac; }));
        continue;
      }
    }
    args.push(MonomFactor(simplifiedArgs[i], power));
  }

  std::sort(args.begin(), args.end());

  auto offs = 0;
  bool needsSorting = false;

  for (unsigned i = 0; i < args.size(); i++) {
    auto& arg = args[i];
    auto c = arg.term.template tryNumeral<Number>();
    if (c.isSome()) {
      // arg is a number constant
      auto num2 = pow(c.unwrap(), arg.power);
      numeral = numeral * num2;
    } else {
      // arg is a non-number term
      auto term  = arg.term;
      auto power = arg.power;
      while (i + 1 < args.size() && args[i + 1].term == term) {
        power += args[i + 1].power;
        i++;
      }
      if (power != 0) {
        args[offs++] = MonomFactor(term, power);
      }
    }
  }
  args.truncate(offs);

  if (needsSorting) {
    std::sort(args.begin(), args.end());
  }

  if (numeral == Numeral(0) && removeZeros) {
    return Monom::zero();
  } else {
    return Monom(numeral, perfect(MonomFactors(std::move(args))));
  }
}